

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O3

void __thiscall
Signal<const_candidacy_msg_&>::emit(Signal<const_candidacy_msg_&> *this,candidacy_msg *p)

{
  _Base_ptr p_Var1;
  undefined8 uVar2;
  _Manager_operation extraout_EDX;
  _Rb_tree_header *p_Var3;
  pair<const_int,_std::function<void_(const_candidacy_msg_&)>_> it;
  
  p_Var1 = (this->slots_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->slots_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    do {
      std::function<void_(const_candidacy_msg_&)>::function
                ((function<void_(const_candidacy_msg_&)> *)&it,
                 (function<void_(const_candidacy_msg_&)> *)&p_Var1[1]._M_parent);
      if (it.second.super__Function_base._M_functor._8_8_ == 0) {
        uVar2 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar2);
      }
      (*it.second.super__Function_base._M_manager)((_Any_data *)&it,(_Any_data *)p,extraout_EDX);
      if (it.second.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)it.second.super__Function_base._M_functor._8_8_)
                  ((_Any_data *)&it,(_Any_data *)&it,3);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
  }
  return;
}

Assistant:

void emit(Args... p) {
    for(auto it : slots_) {
      it.second(p...);
    }
  }